

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *puVar1;
  char **ppcVar2;
  undefined1 *puVar3;
  ushort uVar4;
  Curl_handler *pCVar5;
  curl_trc_feat *pcVar6;
  void *pvVar7;
  bool bVar8;
  undefined4 uVar9;
  _Bool _Var10;
  byte bVar11;
  CURLUcode CVar12;
  int iVar13;
  CURLcode CVar14;
  uint uVar15;
  connectdata *conn;
  char *pcVar16;
  CURLU *u;
  size_t sVar17;
  size_t sVar18;
  stsentry *psVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  CURLcode CVar23;
  char *v;
  ConnectBits CVar24;
  hsts *no_proxy;
  connectdata *conn_00;
  char *pcVar25;
  char *pcVar26;
  curltime cVar27;
  _Bool waitpipe;
  _Bool force_reuse;
  char *newurl;
  connectdata *existing;
  _Bool local_91;
  urlpieces *local_90;
  hsts *local_88;
  _Bool local_79;
  char *local_78 [4];
  _Bool *local_58;
  proxy_info *local_50;
  _Bool *local_48;
  connectdata *local_40;
  char *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  local_40 = (connectdata *)0x0;
  local_79 = false;
  local_91 = false;
  *asyncp = false;
  CVar23 = CURLE_URL_MALFORMAT;
  conn = (connectdata *)0x0;
  CVar14 = CVar23;
  if ((data->state).url == (char *)0x0) goto switchD_00160ca4_caseD_1;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x5c0);
  if (conn == (connectdata *)0x0) {
LAB_00160cf5:
    conn = (connectdata *)0x0;
    goto switchD_00160ca4_caseD_7;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  (conn->primary).remote_port = -1;
  conn->remote_port = -1;
  Curl_conncontrol(conn,1);
  cVar27 = Curl_now();
  (conn->created).tv_sec = cVar27.tv_sec;
  (conn->created).tv_usec = cVar27.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar11 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar11;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar16 = (data->set).str[0x26];
  if ((pcVar16 == (char *)0x0) || (*pcVar16 == '\0')) {
    uVar21 = (ulong)conn->bits & 0xffffffffffffffef;
    uVar22 = 0;
  }
  else {
    uVar21 = (ulong)conn->bits | 0x10;
    uVar22 = 1;
    if (2 < bVar11) {
      uVar22 = (ulong)(bVar11 == 3);
    }
  }
  CVar24 = (ConnectBits)
           ((ulong)(((int)uVar22 * 2 ^ 2U) & (uint)(uVar21 >> 3) & 0x1fffffff) |
            uVar21 & 0xfffffffffffffffc | uVar22);
  conn->bits = CVar24;
  pcVar16 = (data->set).str[0x27];
  if ((pcVar16 != (char *)0x0) && (*pcVar16 != '\0')) {
    CVar24 = (ConnectBits)((ulong)CVar24 | 0x12);
    conn->bits = CVar24;
  }
  CVar24 = (ConnectBits)
           (((ulong)CVar24 & 0xfffffffffffffffb) +
           (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar24;
  uVar21 = (ulong)(*(uint *)&(data->set).field_0x89c >> 8 & 8);
  conn->bits = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffff7 | uVar21);
  uVar22 = (ulong)(*(uint *)&(data->set).field_0x89c >> 1 & 0x8000);
  conn->bits = (ConnectBits)((ulong)CVar24 & 0xffffffffffff7ff7 | uVar21 | uVar22);
  conn->bits = (ConnectBits)
               ((ulong)CVar24 & 0xfffffffffffe7ff7 | uVar21 | uVar22 |
               (ulong)(*(uint *)&(data->set).field_0x89c >> 1 & 0x10000));
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).field_0x89c & 1;
  conn->transport = '\x03';
  Curl_uint_spbset_init(&conn->xfers_attached);
  pcVar16 = (data->set).str[0x1e];
  if (pcVar16 != (char *)0x0) {
    pcVar16 = (*Curl_cstrdup)(pcVar16);
    conn->localdev = pcVar16;
    if (pcVar16 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      goto LAB_00160cf5;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar7 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar7;
  iVar13 = (conn->created).tv_usec;
  uVar9 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar13;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar9;
  local_48 = protocol_done;
  Curl_hash_init(&conn->meta_hash,0x17,Curl_hash_str,Curl_str_key_compare,conn_meta_freeentry);
  local_58 = asyncp;
  if ((data->set).uh == (CURLU *)0x0) {
    up_free(data);
LAB_00160bd2:
    bVar8 = false;
    u = curl_url();
  }
  else {
    bVar11 = (data->state).field_0x7be;
    up_free(data);
    if ((bVar11 & 8) != 0) goto LAB_00160bd2;
    u = curl_url_dup((data->set).uh);
    bVar8 = true;
  }
  (data->state).uh = u;
  if (u == (CURLU *)0x0) goto switchD_00160ca4_caseD_7;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar17 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar17 == 0)) {
    pcVar16 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar16 == (char *)0x0) goto switchD_00160ca4_caseD_7;
    uVar15 = *(uint *)&(data->state).field_0x7be;
    if ((uVar15 >> 0x10 & 1) != 0) {
      (*Curl_cfree)((data->state).url);
      uVar15 = *(uint *)&(data->state).field_0x7be;
    }
    (data->state).url = pcVar16;
    *(uint *)&(data->state).field_0x7be = uVar15 | 0x10000;
  }
  if (!bVar8) {
    uVar15 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x89c >> 0x20);
    CVar12 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                          (uVar15 >> 0xc & 0x20) + (uVar15 >> 7 & 0x10) + 0x208);
    if (CVar12 == CURLUE_OK) {
      CVar12 = curl_url_get(u,CURLUPART_URL,local_78,0);
      CVar14 = CURLE_URL_MALFORMAT;
      switch(CVar12) {
      case CURLUE_OK:
        uVar15 = *(uint *)&(data->state).field_0x7be;
        if ((uVar15 >> 0x10 & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar15 = *(uint *)&(data->state).field_0x7be;
        }
        (data->state).url = local_78[0];
        *(uint *)&(data->state).field_0x7be = uVar15 | 0x10000;
        goto LAB_00160c76;
      case CURLUE_UNSUPPORTED_SCHEME:
        CVar14 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
        CVar14 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
        CVar14 = CURLE_LOGIN_DENIED;
      }
    }
    else {
      pcVar16 = curl_url_strerror(CVar12);
      Curl_failf(data,"URL rejected: %s",pcVar16);
      CVar14 = CURLE_URL_MALFORMAT;
      if (CVar12 - CURLUE_UNSUPPORTED_SCHEME < 4) {
        CVar14 = *(CURLcode *)(&DAT_00182b5c + (ulong)(CVar12 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      }
    }
    goto switchD_00160ca4_caseD_1;
  }
LAB_00160c76:
  puVar1 = &(data->state).up;
  CVar12 = curl_url_get(u,CURLUPART_SCHEME,&puVar1->scheme,0);
  CVar14 = CVar23;
  switch(CVar12) {
  case CURLUE_OK:
    ppcVar2 = &(data->state).up.hostname;
    CVar12 = curl_url_get(u,CURLUPART_HOST,ppcVar2,0);
    if (CVar12 == CURLUE_OK) {
      pcVar16 = *ppcVar2;
      sVar18 = strlen(pcVar16);
      if (0xffff < sVar18) {
        Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
        goto switchD_00160ca4_caseD_1;
      }
    }
    else {
      iVar13 = curl_strequal("file",puVar1->scheme);
      if (iVar13 == 0) goto switchD_00160ca4_caseD_7;
      pcVar16 = *ppcVar2;
    }
    local_90 = puVar1;
    if (pcVar16 == (char *)0x0) {
      pcVar25 = (char *)0x0;
    }
    else {
      pcVar25 = pcVar16;
      if (*pcVar16 == '[') {
        puVar3 = &(conn->bits).field_0x1;
        *puVar3 = *puVar3 | 4;
        pcVar25 = pcVar16 + 1;
        sVar18 = strlen(pcVar25);
        pcVar16[sVar18] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    if (pcVar25 == (char *)0x0) {
      pcVar25 = "";
    }
    pcVar16 = (*Curl_cstrdup)(pcVar25);
    (conn->host).rawalloc = pcVar16;
    if (pcVar16 == (char *)0x0) goto switchD_00160ca4_caseD_7;
    (conn->host).name = pcVar16;
    CVar14 = Curl_idnconvert_hostname(&conn->host);
    if (CVar14 != CURLE_OK) goto switchD_00160ca4_caseD_1;
    if ((data->hsts != (hsts *)0x0) &&
       (iVar13 = curl_strequal("http",local_90->scheme), iVar13 != 0)) {
      local_88 = data->hsts;
      pcVar16 = (conn->host).name;
      sVar18 = strlen(pcVar16);
      psVar19 = Curl_hsts(local_88,pcVar16,sVar18,true);
      puVar1 = local_90;
      if (psVar19 != (stsentry *)0x0) {
        (*Curl_cfree)(local_90->scheme);
        puVar1->scheme = (char *)0x0;
        CVar12 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
        CVar14 = CURLE_URL_MALFORMAT;
        switch(CVar12) {
        case CURLUE_OK:
          if (((data->state).field_0x7c0 & 1) != 0) {
            (*Curl_cfree)((data->state).url);
            (data->state).url = (char *)0x0;
          }
          CVar12 = curl_url_get(u,CURLUPART_URL,local_78,0);
          switch(CVar12) {
          case CURLUE_OK:
            CVar12 = curl_url_get(u,CURLUPART_SCHEME,&local_90->scheme,0);
            local_88 = (hsts *)CONCAT44(local_88._4_4_,CVar12);
            if (CVar12 == CURLUE_OK) {
              (data->state).url = local_78[0];
              puVar3 = &(data->state).field_0x7c0;
              *puVar3 = *puVar3 | 1;
              if ((((data->set).field_0x89f & 0x40) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
              }
              goto LAB_0016108c;
            }
            (*Curl_cfree)(local_78[0]);
            if ((curl_proxytype)local_88 - 5 < 4) {
              CVar14 = *(CURLcode *)(&DAT_00182b5c + (ulong)((curl_proxytype)local_88 - 5) * 4);
            }
            break;
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_00160f9f_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_00160f9f_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_00160f9f_caseD_8;
          }
          break;
        case CURLUE_UNSUPPORTED_SCHEME:
switchD_00160f9f_caseD_5:
          CVar14 = CURLE_UNSUPPORTED_PROTOCOL;
          break;
        case CURLUE_OUT_OF_MEMORY:
switchD_00160f9f_caseD_7:
          CVar14 = CURLE_OUT_OF_MEMORY;
          break;
        case CURLUE_USER_NOT_ALLOWED:
switchD_00160f9f_caseD_8:
          CVar14 = CURLE_LOGIN_DENIED;
        }
        goto switchD_00160ca4_caseD_1;
      }
    }
LAB_0016108c:
    pcVar16 = "";
    CVar14 = findprotocol(data,conn,(data->state).up.scheme);
    if (CVar14 != CURLE_OK) goto switchD_00160ca4_caseD_5;
    if (((data->state).aptr.passwd == (char *)0x0) ||
       ((*(uint *)&(data->state).field_0x7be & 3) != 2)) {
      ppcVar2 = &(data->state).up.password;
      CVar12 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar2,0);
      switch(CVar12) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00160ca4_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
switchD_001610f7_caseD_6:
        CVar14 = CURLE_URL_MALFORMAT;
        goto switchD_00160ca4_caseD_1;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00160ca4_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00160ca4_caseD_8;
      case CURLUE_NO_PASSWORD:
        break;
      default:
        if (CVar12 != CURLUE_OK) goto switchD_001610f7_caseD_6;
        CVar14 = Curl_urldecode(*ppcVar2,0,local_78,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar14 != CURLE_OK) goto switchD_00160ca4_caseD_1;
        conn->passwd = local_78[0];
        CVar14 = Curl_setstropt(&(data->state).aptr.passwd,local_78[0]);
        if (CVar14 != CURLE_OK) goto switchD_00160ca4_caseD_1;
        *(uint *)&(data->state).field_0x7be = (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1
        ;
      }
    }
    if (((data->state).aptr.user == (char *)0x0) || ((*(uint *)&(data->state).field_0x7be & 3) != 2)
       ) {
      ppcVar2 = &(data->state).up.user;
      CVar12 = curl_url_get(u,CURLUPART_USER,ppcVar2,0);
      CVar14 = CVar23;
      switch(CVar12) {
      case CURLUE_OK:
        CVar14 = Curl_urldecode(*ppcVar2,0,local_78,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar14 != CURLE_OK) goto switchD_00160ca4_caseD_1;
        conn->user = local_78[0];
        CVar14 = Curl_setstropt(&(data->state).aptr.user,local_78[0]);
        *(uint *)&(data->state).field_0x7be = (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1
        ;
        if (CVar14 != CURLE_OK) goto switchD_00160ca4_caseD_1;
        break;
      default:
        goto switchD_00160ca4_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00160ca4_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00160ca4_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00160ca4_caseD_8;
      case CURLUE_NO_USER:
        break;
      }
    }
    break;
  default:
    goto switchD_00160ca4_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_00160ca4_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_00160ca4_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_00160ca4_caseD_8;
  }
  ppcVar2 = &(data->state).up.options;
  CVar12 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar2,0x40);
  CVar14 = CVar23;
  switch(CVar12) {
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_00160ca4_caseD_5:
    CVar14 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_URLDECODE:
  case CURLUE_UNKNOWN_PART:
  case CURLUE_NO_SCHEME:
  case CURLUE_NO_USER:
  case CURLUE_NO_PASSWORD:
    break;
  case CURLUE_USER_NOT_ALLOWED:
switchD_00160ca4_caseD_8:
    CVar14 = CURLE_LOGIN_DENIED;
    break;
  case CURLUE_NO_OPTIONS:
switchD_001611df_caseD_d:
    CVar12 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
    switch(CVar12) {
    case CURLUE_OK:
      ppcVar2 = &(data->state).up.port;
      CVar12 = curl_url_get(u,CURLUPART_PORT,ppcVar2,1);
      if (CVar12 == CURLUE_OK) {
        uVar4 = (data->set).use_port;
        if ((uVar4 == 0) || (uVar15 = (uint)uVar4, ((data->state).field_0x7be & 0x40) == 0)) {
          local_38 = *ppcVar2;
          iVar13 = Curl_str_number(&local_38,(curl_off_t *)local_78,0xffff);
          uVar15 = (uint)local_78[0];
          if (iVar13 != 0) goto LAB_0016133c;
        }
        conn->remote_port = uVar15 & 0xffff;
        (conn->primary).remote_port = uVar15 & 0xffff;
      }
      else {
        iVar13 = curl_strequal("file",local_90->scheme);
        if (iVar13 == 0) goto switchD_00160ca4_caseD_7;
      }
LAB_0016133c:
      curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
      uVar15 = (data->set).scope_id;
      if (uVar15 != 0) {
        conn->scope_id = uVar15;
      }
      pcVar25 = (data->set).str[0x42];
      if (pcVar25 != (char *)0x0) {
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        conn->sasl_authzid = pcVar25;
        if (pcVar25 == (char *)0x0) goto switchD_00160ca4_caseD_7;
      }
      pcVar25 = (data->set).str[0x3c];
      if (pcVar25 != (char *)0x0) {
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        conn->oauth_bearer = pcVar25;
        if (pcVar25 == (char *)0x0) goto switchD_00160ca4_caseD_7;
      }
      pcVar25 = (data->set).str[0x3d];
      if (pcVar25 == (char *)0x0) {
        CVar24 = conn->bits;
      }
      else {
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        conn->unix_domain_socket = pcVar25;
        if (pcVar25 == (char *)0x0) goto switchD_00160ca4_caseD_7;
        CVar24 = (ConnectBits)
                 ((ulong)conn->bits & 0xfffffffffbffffff |
                 (ulong)((uint)(*(ulong *)&(data->set).field_0x89c >> 0x16) & 0x4000000));
        conn->bits = CVar24;
      }
      if (((ulong)CVar24 & 4) == 0) {
LAB_0016145e:
        pcVar25 = (data->set).str[0x26];
        if (pcVar25 == (char *)0x0) {
          pcVar25 = (char *)0x0;
        }
        else {
          pcVar25 = (*Curl_cstrdup)(pcVar25);
          if (pcVar25 == (char *)0x0) {
            Curl_failf(data,"memory shortage");
            CVar14 = CURLE_OUT_OF_MEMORY;
            goto LAB_001616d2;
          }
        }
        pcVar26 = (data->set).str[0x27];
        if (pcVar26 == (char *)0x0) {
          local_90 = (urlpieces *)0x0;
LAB_001614e8:
          if ((data->set).str[0x32] == (char *)0x0) {
            pcVar26 = "no_proxy";
            local_88 = (hsts *)curl_getenv("no_proxy");
            if (local_88 == (hsts *)0x0) {
              pcVar26 = "NO_PROXY";
              local_88 = (hsts *)curl_getenv("NO_PROXY");
              if (local_88 == (hsts *)0x0) goto LAB_001614f6;
            }
            if ((((data->set).field_0x89f & 0x40) != 0) &&
               ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                (0 < pcVar6->log_level)))) {
              Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,local_88);
            }
          }
          else {
LAB_001614f6:
            local_88 = (hsts *)0x0;
          }
          no_proxy = (hsts *)(data->set).str[0x32];
          if (no_proxy == (hsts *)0x0) {
            no_proxy = local_88;
          }
          _Var10 = Curl_check_noproxy((conn->host).name,(char *)no_proxy);
          if (_Var10) {
            (*Curl_cfree)(pcVar25);
            (*Curl_cfree)(local_90);
            (*Curl_cfree)(local_88);
LAB_00161744:
            uVar21 = (ulong)conn->bits & 0xfffffffffffffffc;
          }
          else {
            if (pcVar25 == (char *)0x0 && local_90 == (urlpieces *)0x0) {
              pcVar26 = (char *)local_78;
              curl_msnprintf(pcVar26,0x14,"%s_proxy",conn->handler->scheme);
              pcVar25 = curl_getenv(pcVar26);
              if (pcVar25 == (char *)0x0) {
                v = "http_proxy";
                pcVar26 = (char *)local_78;
                iVar13 = curl_strequal("http_proxy",pcVar26);
                if (iVar13 == 0) {
                  Curl_strntoupper(pcVar26,pcVar26,0x14);
                  pcVar25 = curl_getenv(pcVar26);
                  if (pcVar25 != (char *)0x0) goto LAB_00161584;
                }
                iVar13 = curl_strequal("ws_proxy",(char *)local_78);
                if (iVar13 == 0) {
                  pcVar26 = (char *)local_78;
                  iVar13 = curl_strequal("wss_proxy",pcVar26);
                  if (iVar13 != 0) {
                    pcVar25 = curl_getenv("https_proxy");
                    if (pcVar25 != (char *)0x0) goto LAB_00161584;
                    v = "HTTPS_PROXY";
                    goto LAB_00161a9b;
                  }
                }
                else {
LAB_00161a9b:
                  pcVar25 = curl_getenv(v);
                  if (pcVar25 != (char *)0x0) {
                    pcVar26 = (char *)local_78;
                    goto LAB_00161584;
                  }
                }
                pcVar26 = "all_proxy";
                pcVar25 = curl_getenv("all_proxy");
                if (pcVar25 == (char *)0x0) {
                  pcVar26 = "ALL_PROXY";
                  pcVar25 = curl_getenv("ALL_PROXY");
                  if (pcVar25 == (char *)0x0) {
                    pcVar25 = (char *)0x0;
                    goto LAB_001615b6;
                  }
                }
              }
LAB_00161584:
              if ((((data->set).field_0x89f & 0x40) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar26,pcVar25);
              }
            }
LAB_001615b6:
            (*Curl_cfree)(local_88);
            if (pcVar25 == (char *)0x0) {
LAB_001615e3:
              pcVar25 = (char *)0x0;
            }
            else if (((conn->unix_domain_socket != (char *)0x0) || (*pcVar25 == '\0')) ||
                    ((conn->handler->flags & 0x10) != 0)) {
              (*Curl_cfree)(pcVar25);
              goto LAB_001615e3;
            }
            if (local_90 == (urlpieces *)0x0) {
LAB_001616ee:
              if (pcVar25 == (char *)0x0) goto LAB_00161744;
              local_88 = (hsts *)CONCAT44(local_88._4_4_,(uint)(conn->http_proxy).proxytype);
              local_90 = (urlpieces *)0x0;
              bVar8 = false;
LAB_00161717:
              local_50 = &conn->http_proxy;
              CVar14 = parse_proxy(data,conn,pcVar25,(curl_proxytype)local_88);
              (*Curl_cfree)(pcVar25);
              if (CVar14 != CURLE_OK) {
                pcVar25 = (char *)0x0;
                goto LAB_0016179b;
              }
              if (bVar8) goto LAB_001619de;
            }
            else {
              if ((*(char *)&local_90->scheme == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                (*Curl_cfree)(local_90);
                goto LAB_001616ee;
              }
              local_50 = &conn->http_proxy;
              local_88 = (hsts *)CONCAT44(local_88._4_4_,(uint)(conn->http_proxy).proxytype);
              bVar8 = true;
              if (pcVar25 != (char *)0x0) goto LAB_00161717;
LAB_001619de:
              puVar1 = local_90;
              CVar14 = parse_proxy(data,conn,(char *)local_90,(curl_proxytype)local_88);
              (*Curl_cfree)(puVar1);
              if (CVar14 != CURLE_OK) goto LAB_001616d2;
            }
            if ((local_50->host).rawalloc == (char *)0x0) {
              CVar24 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
              conn->bits = CVar24;
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_00161be2;
              if ((conn->socks_proxy).user == (char *)0x0) {
                pcVar25 = (conn->socks_proxy).passwd;
                (conn->socks_proxy).user = (conn->http_proxy).user;
                (conn->http_proxy).user = (char *)0x0;
                (*Curl_cfree)(pcVar25);
                (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                (conn->http_proxy).passwd = (char *)0x0;
                CVar24 = conn->bits;
              }
            }
            else {
              CVar24 = conn->bits;
              if ((conn->handler->protocol & 0xc0000003) == 0) {
                if (((conn->handler->flags & 0x800) == 0) || (((ulong)CVar24 & 8) != 0)) {
                  CVar24 = (ConnectBits)((ulong)CVar24 | 8);
                }
                else {
                  conn->handler = &Curl_handler_http;
                }
              }
              CVar24 = (ConnectBits)((ulong)CVar24 | 1);
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_00161be2:
                uVar21 = (ulong)CVar24 & 0xfffffffffffffffd;
                goto LAB_0016174f;
              }
            }
            uVar21 = (ulong)CVar24 | 2;
          }
LAB_0016174f:
          uVar22 = 0x10;
          if ((uVar21 & 1) == 0) {
            uVar22 = (ulong)((int)uVar21 * 8 & 0x10);
          }
          conn->bits = (ConnectBits)(uVar21 & 0xffffffffffffffef | uVar22);
          if (uVar22 == 0) {
            conn->bits = (ConnectBits)(uVar21 & 0xffffffffffffffe0);
            (conn->http_proxy).proxytype = '\0';
          }
          pcVar25 = (char *)0x0;
          local_90 = (urlpieces *)0x0;
          CVar14 = CURLE_OK;
        }
        else {
          local_90 = (urlpieces *)(*Curl_cstrdup)(pcVar26);
          if (local_90 != (urlpieces *)0x0) goto LAB_001614e8;
          local_90 = (urlpieces *)0x0;
          Curl_failf(data,"memory shortage");
          CVar14 = CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        pcVar25 = (data->state).aptr.proxyuser;
        pcVar26 = (data->state).aptr.proxypasswd;
        if (pcVar25 == (char *)0x0) {
          pcVar25 = "";
        }
        pcVar25 = (*Curl_cstrdup)(pcVar25);
        (conn->http_proxy).user = pcVar25;
        CVar14 = CURLE_OUT_OF_MEMORY;
        if (pcVar25 != (char *)0x0) {
          if (pcVar26 == (char *)0x0) {
            pcVar26 = "";
          }
          pcVar25 = (*Curl_cstrdup)(pcVar26);
          (conn->http_proxy).passwd = pcVar25;
          if (pcVar25 != (char *)0x0) goto LAB_0016145e;
          (*Curl_cfree)((conn->http_proxy).user);
          (conn->http_proxy).user = (char *)0x0;
        }
LAB_001616d2:
        pcVar25 = (char *)0x0;
        local_90 = (urlpieces *)0x0;
      }
LAB_0016179b:
      (*Curl_cfree)(local_90);
      (*Curl_cfree)(pcVar25);
      if (CVar14 != CURLE_OK) break;
      if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
        conn->bits = (ConnectBits)((ulong)conn->bits | 8);
      }
      uVar4 = (data->set).use_port;
      if ((uVar4 != 0) && (((data->state).field_0x7be & 0x40) != 0)) {
        conn->remote_port = (uint)uVar4;
        curl_msnprintf((char *)local_78,0x10,"%d");
        CVar12 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_78,0);
        if (CVar12 != CURLUE_OK) goto switchD_00160ca4_caseD_7;
      }
      CVar14 = override_login(data,conn);
      if (((CVar14 != CURLE_OK) || (CVar14 = set_login(data,conn), CVar14 != CURLE_OK)) ||
         (CVar14 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar14 != CURLE_OK))
      break;
      CVar24 = conn->bits;
      if (((ulong)CVar24 & 1) != 0) {
        CVar14 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
        if (CVar14 != CURLE_OK) break;
        CVar24 = conn->bits;
      }
      if (((ulong)CVar24 & 2) != 0) {
        CVar14 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
        if (CVar14 != CURLE_OK) break;
        CVar24 = conn->bits;
      }
      if ((CVar24._0_4_ >> 8 & 1) != 0) {
        CVar14 = Curl_idnconvert_hostname(&conn->conn_to_host);
        if (CVar14 != CURLE_OK) break;
        CVar24 = conn->bits;
        if ((CVar24._0_4_ >> 8 & 1) != 0) {
          iVar13 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
          CVar24 = conn->bits;
          if (iVar13 != 0) {
            CVar24 = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffeff);
            conn->bits = CVar24;
          }
        }
      }
      if (((CVar24._0_4_ >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
        CVar24 = (ConnectBits)((ulong)CVar24 & 0xfffffffffffffdff);
        conn->bits = CVar24;
      }
      if (((ulong)CVar24 & 1) != 0 && ((ulong)CVar24 & 0x300) != 0) {
        conn->bits = (ConnectBits)((ulong)CVar24 | 8);
      }
      CVar14 = setup_connection_internals(data,conn);
      if (CVar14 != CURLE_OK) break;
      pCVar5 = conn->handler;
      if ((pCVar5->flags & 0x10) == 0) {
        conn->recv[0] = Curl_cf_recv;
        conn->send[0] = Curl_cf_send;
        conn->recv[1] = Curl_cf_recv;
        conn->send[1] = Curl_cf_send;
        conn->bits = (ConnectBits)
                     ((ulong)conn->bits & 0xffffffffff7fffff |
                     (ulong)((uint)(*(ulong *)&(data->set).field_0x89c >> 0x12) & 0x800000));
        CVar14 = Curl_ssl_easy_config_complete(data);
        if (CVar14 != CURLE_OK) break;
        Curl_cpool_prune_dead(data);
        uVar21 = *(ulong *)&(data->set).field_0x89c;
        if ((uVar21 >> 0x20 & 1) != 0) {
          if (((uVar21 & 1) == 0) && ((data->state).followlocation != 0)) goto LAB_00161d28;
LAB_00161e59:
          if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8a1 & 4) != 0)) {
            puVar3 = &(conn->bits).field_0x3;
            *puVar3 = *puVar3 | 1;
          }
          if (local_91 == true) {
            if ((((data->set).field_0x89f & 0x40) != 0) &&
               ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                (0 < pcVar6->log_level)))) {
              pcVar16 = "Waiting on connection to negotiate possible multiplexing.";
LAB_00161ee0:
              Curl_infof(data,pcVar16);
            }
          }
          else {
            iVar13 = Curl_cpool_check_limits(data,conn);
            if (iVar13 == 2) {
              uVar15 = (uint)*(undefined8 *)&(data->set).field_0x89c;
              if (data->master_mid != 0xffffffff) {
                if (((uVar15 >> 0x1e & 1) != 0) &&
                   (((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar6->log_level)) && (0 < Curl_trc_feat_multi.log_level)))) {
                  Curl_trc_multi(data,
                                 "Allowing sub-requests (like DoH) to override max connection limit"
                                );
                }
                goto LAB_00161f49;
              }
              if (((uVar15 >> 0x1e & 1) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                Curl_infof(data,"No connections available, total of %ld reached.",
                           data->multi->max_total_connections);
              }
            }
            else {
              if (iVar13 != 1) {
LAB_00161f49:
                CVar14 = Curl_ssl_conn_config_init(data,conn);
                if (CVar14 != CURLE_OK) break;
                Curl_attach_connection(data,conn);
                CVar14 = Curl_cpool_add(data,conn);
                if (CVar14 != CURLE_OK) break;
                if ((((data->state).authhost.picked & 8) != 0) &&
                   (bVar11 = (data->state).authhost.field_0x18, (bVar11 & 1) != 0)) {
                  if ((((data->set).field_0x89f & 0x40) != 0) &&
                     ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar6->log_level)))) {
                    Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                    bVar11 = (data->state).authhost.field_0x18;
                  }
                  (data->state).authhost.picked = 0;
                  (data->state).authhost.field_0x18 = bVar11 & 0xfe;
                }
                conn_00 = conn;
                if ((((data->state).authproxy.picked & 8) != 0) &&
                   (bVar11 = (data->state).authproxy.field_0x18, (bVar11 & 1) != 0)) {
                  if ((((data->set).field_0x89f & 0x40) != 0) &&
                     ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar6->log_level)))) {
                    Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                    bVar11 = (data->state).authproxy.field_0x18;
                  }
                  (data->state).authproxy.picked = 0;
                  (data->state).authproxy.field_0x18 = bVar11 & 0xfe;
                }
                goto LAB_00161e0b;
              }
              if ((((data->set).field_0x89f & 0x40) != 0) &&
                 ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar6->log_level)))) {
                pcVar16 = "No more connections allowed to host";
                goto LAB_00161ee0;
              }
            }
          }
          Curl_conn_free(data,conn);
          CVar14 = CURLE_NO_CONNECTION_AVAILABLE;
          conn = (connectdata *)0x0;
          break;
        }
        if ((uVar21 & 1) != 0) goto LAB_00161e59;
LAB_00161d28:
        _Var10 = ConnectionExists(data,conn,&local_40,&local_79,&local_91);
        if (!_Var10) goto LAB_00161e59;
        if ((conn->given->flags & 1) == 0) {
          _Var10 = Curl_conn_is_ssl(conn,0);
          pcVar16 = "";
          if (_Var10) {
            pcVar16 = " (upgraded to SSL)";
          }
        }
        conn_00 = local_40;
        reuse_conn(data,conn,local_40);
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar6 = (data->state).feat, pcVar6 == (curl_trc_feat *)0x0 || (0 < pcVar6->log_level))
           )) {
          pcVar25 = "proxy";
          if (((ulong)conn_00->bits & 0x10) == 0) {
            pcVar25 = "host";
          }
          lVar20 = 0x108;
          if (((conn_00->socks_proxy).host.name == (char *)0x0) &&
             (lVar20 = 0x140, (conn_00->http_proxy).host.name == (char *)0x0)) {
            lVar20 = 0xb8;
          }
          Curl_infof(data,"Re-using existing %s: connection%s with %s %s",conn_00->given->scheme,
                     pcVar16,pcVar25,*(undefined8 *)((long)&(conn_00->cpool_node)._list + lVar20));
        }
LAB_00161e0b:
        CVar14 = Curl_init_do(data,conn_00);
        conn = conn_00;
        if ((CVar14 != CURLE_OK) || (CVar14 = setup_range(data), CVar14 != CURLE_OK)) break;
        if (((ulong)conn_00->bits & 0x40) == 0) {
          CVar14 = resolve_server(data,conn_00,local_58);
          if (CVar14 != CURLE_OK) goto LAB_00161cc8;
        }
        else {
          *local_58 = false;
        }
        pCVar5 = conn_00->handler;
        (data->info).conn_scheme = pCVar5->scheme;
        (data->info).conn_protocol = pCVar5->protocol & 0x3ffffff;
        (data->info).field_0xf4 = (data->info).field_0xf4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
        CVar14 = Curl_conn_ev_data_setup(data);
      }
      else {
        (data->info).conn_scheme = pCVar5->scheme;
        (data->info).conn_protocol = pCVar5->protocol & 0x3ffffff;
        CVar14 = (*pCVar5->connect_it)(data,(_Bool *)local_78);
        if (CVar14 == CURLE_OK) {
          Curl_attach_connection(data,conn);
          CVar14 = Curl_cpool_add(data,conn);
          if ((CVar14 == CURLE_OK) && (CVar14 = setup_range(data), CVar14 == CURLE_OK)) {
            Curl_xfer_setup_nop(data);
            CVar14 = Curl_init_do(data,conn);
            if (CVar14 == CURLE_OK) {
              CVar14 = CURLE_OK;
              goto LAB_00161cc8;
            }
          }
          (*conn->handler->done)(data,CVar14,false);
        }
      }
LAB_00161cc8:
      if (CVar14 == CURLE_OK) {
        uVar15 = Curl_uint_spbset_count(&conn->xfers_attached);
        if (1 < uVar15) {
          *local_48 = true;
          return CURLE_OK;
        }
        if (*local_58 != false) {
          return CURLE_OK;
        }
        CVar14 = Curl_setup_conn(data,local_48);
      }
    default:
      break;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_00160ca4_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_00160ca4_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_00160ca4_caseD_8;
    }
  default:
    if (CVar12 != CURLUE_OK) break;
    pcVar25 = (*Curl_cstrdup)(*ppcVar2);
    conn->options = pcVar25;
    if (pcVar25 != (char *)0x0) goto switchD_001611df_caseD_d;
  case CURLUE_OUT_OF_MEMORY:
switchD_00160ca4_caseD_7:
    CVar14 = CURLE_OUT_OF_MEMORY;
  }
switchD_00160ca4_caseD_1:
  CVar23 = CURLE_NO_CONNECTION_AVAILABLE;
  if (((CVar14 != CURLE_NO_CONNECTION_AVAILABLE) && (CVar23 = CVar14, conn != (connectdata *)0x0))
     && (CVar14 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_conn_terminate(data,conn,true);
  }
  return CVar23;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_ATTACHED(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conn_terminate(data, conn, TRUE);
  }

  return result;
}